

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_get_cookie(char *cookie_header,char *var_name,char *dst,size_t dst_size)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  char *__s;
  
  if (dst_size == 0 || dst == (char *)0x0) {
    return -2;
  }
  *dst = '\0';
  if (cookie_header == (char *)0x0 || var_name == (char *)0x0) {
    return -1;
  }
  sVar2 = strlen(cookie_header);
  pcVar3 = mg_strcasestr(cookie_header,var_name);
  if (pcVar3 != (char *)0x0) {
    sVar4 = strlen(var_name);
    do {
      if ((pcVar3[(int)sVar4] == '=') && ((pcVar3 == cookie_header || (pcVar3[-1] == ' ')))) {
        lVar10 = (long)((sVar4 << 0x20) + 0x100000000) >> 0x20;
        __s = pcVar3 + lVar10;
        pcVar5 = strchr(__s,0x20);
        pcVar7 = cookie_header + sVar2;
        if (pcVar5 != (char *)0x0) {
          pcVar7 = pcVar5;
        }
        pcVar5 = pcVar7 + -1;
        if (pcVar7[-1] != ';') {
          pcVar5 = pcVar7;
        }
        if ((pcVar3[lVar10] == '\"') && (pcVar5[-1] == '\"')) {
          if (__s + 1 < pcVar5) {
            pcVar5 = pcVar5 + -1;
            __s = __s + 1;
          }
        }
        if (dst_size <= (ulong)((long)pcVar5 - (long)__s)) {
          return -3;
        }
        iVar9 = (int)((long)pcVar5 - (long)__s);
        uVar8 = (ulong)iVar9;
        if ((uVar8 + 1 < 2) || (cVar6 = *__s, cVar6 == '\0')) goto LAB_0010e8a5;
        goto LAB_0010e889;
      }
      pcVar3 = mg_strcasestr(pcVar3 + (int)sVar4,var_name);
    } while (pcVar3 != (char *)0x0);
  }
  return -1;
  while (bVar1 = 1 < uVar8, uVar8 = uVar8 - 1, bVar1) {
LAB_0010e889:
    __s = __s + 1;
    *dst = cVar6;
    dst = dst + 1;
    cVar6 = *__s;
    if (cVar6 == '\0') break;
  }
LAB_0010e8a5:
  *dst = '\0';
  return iVar9;
}

Assistant:

CIVETWEB_API int
mg_get_cookie(const char *cookie_header,
              const char *var_name,
              char *dst,
              size_t dst_size)
{
	const char *s, *p, *end;
	int name_len, len = -1;

	if ((dst == NULL) || (dst_size == 0)) {
		return -2;
	}

	dst[0] = '\0';
	if ((var_name == NULL) || ((s = cookie_header) == NULL)) {
		return -1;
	}

	name_len = (int)strlen(var_name);
	end = s + strlen(s);
	for (; (s = mg_strcasestr(s, var_name)) != NULL; s += name_len) {
		if (s[name_len] == '=') {
			/* HCP24: now check is it a substring or a full cookie name */
			if ((s == cookie_header) || (s[-1] == ' ')) {
				s += name_len + 1;
				if ((p = strchr(s, ' ')) == NULL) {
					p = end;
				}
				if (p[-1] == ';') {
					p--;
				}
				if ((*s == '"') && (p[-1] == '"') && (p > s + 1)) {
					s++;
					p--;
				}
				if ((size_t)(p - s) < dst_size) {
					len = (int)(p - s);
					mg_strlcpy(dst, s, (size_t)len + 1);
				} else {
					len = -3;
				}
				break;
			}
		}
	}
	return len;
}